

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  _Bool _Var1;
  CURLcode result;
  int remote_port_local;
  char *hostname_local;
  int sockindex_local;
  connectdata *conn_local;
  
  if (((conn->connect_state != (http_connect_state *)0x0) ||
      (conn_local._4_4_ = connect_init(conn,false), conn_local._4_4_ == CURLE_OK)) &&
     ((conn_local._4_4_ = CONNECT(conn,sockindex,hostname,remote_port), conn_local._4_4_ != CURLE_OK
      || (_Var1 = Curl_connect_complete(conn), _Var1)))) {
    connect_done(conn);
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}